

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O0

void leveldb_writebatch_iterate
               (leveldb_writebatch_t *b,void *state,
               _func_void_void_ptr_char_ptr_size_t_char_ptr_size_t *put,
               _func_void_void_ptr_char_ptr_size_t *deleted)

{
  undefined1 local_50 [16];
  H handler;
  _func_void_void_ptr_char_ptr_size_t *deleted_local;
  _func_void_void_ptr_char_ptr_size_t_char_ptr_size_t *put_local;
  void *state_local;
  leveldb_writebatch_t *b_local;
  
  handler.deleted_ = deleted;
  leveldb_writebatch_iterate::H::H((H *)(local_50 + 8));
  handler.put_ = (_func_void_void_ptr_char_ptr_size_t_char_ptr_size_t *)handler.deleted_;
  handler.super_Handler._vptr_Handler = (_func_int **)state;
  handler.state_ = put;
  leveldb::WriteBatch::Iterate((WriteBatch *)local_50,(Handler *)b);
  leveldb::Status::~Status((Status *)local_50);
  leveldb_writebatch_iterate::H::~H((H *)(local_50 + 8));
  return;
}

Assistant:

void leveldb_writebatch_iterate(const leveldb_writebatch_t* b, void* state,
                                void (*put)(void*, const char* k, size_t klen,
                                            const char* v, size_t vlen),
                                void (*deleted)(void*, const char* k,
                                                size_t klen)) {
  class H : public WriteBatch::Handler {
   public:
    void* state_;
    void (*put_)(void*, const char* k, size_t klen, const char* v, size_t vlen);
    void (*deleted_)(void*, const char* k, size_t klen);
    void Put(const Slice& key, const Slice& value) override {
      (*put_)(state_, key.data(), key.size(), value.data(), value.size());
    }
    void Delete(const Slice& key) override {
      (*deleted_)(state_, key.data(), key.size());
    }
  };
  H handler;
  handler.state_ = state;
  handler.put_ = put;
  handler.deleted_ = deleted;
  b->rep.Iterate(&handler);
}